

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

void __thiscall icu_63::RegexCompile::fixLiterals(RegexCompile *this,UBool split)

{
  UBool UVar1;
  int32_t iVar2;
  __off_t __length;
  UnicodeString *srcText;
  UChar32 local_1c;
  uint local_18;
  UChar32 lastCodePoint;
  int32_t indexOfLastCodePoint;
  UBool split_local;
  RegexCompile *this_local;
  
  iVar2 = icu_63::UnicodeString::length(&this->fLiteralChars);
  if (iVar2 != 0) {
    iVar2 = icu_63::UnicodeString::length(&this->fLiteralChars);
    local_18 = icu_63::UnicodeString::moveIndex32(&this->fLiteralChars,iVar2,-1);
    local_1c = icu_63::UnicodeString::char32At(&this->fLiteralChars,local_18);
    if (split == '\0') {
      if ((this->fModeFlags & 2U) != 0) {
        icu_63::UnicodeString::foldCase(&this->fLiteralChars,0);
        iVar2 = icu_63::UnicodeString::length(&this->fLiteralChars);
        local_18 = icu_63::UnicodeString::moveIndex32(&this->fLiteralChars,iVar2,-1);
        local_1c = icu_63::UnicodeString::char32At(&this->fLiteralChars,local_18);
      }
      if (local_18 == 0) {
        if (((this->fModeFlags & 2U) == 0) ||
           (UVar1 = u_hasBinaryProperty_63(local_1c,UCHAR_CASE_SENSITIVE), UVar1 == '\0')) {
          srcText = (UnicodeString *)0x3;
          appendOp(this,3,local_1c);
        }
        else {
          srcText = (UnicodeString *)0x27;
          appendOp(this,0x27,local_1c);
        }
      }
      else {
        iVar2 = icu_63::UnicodeString::length(&this->fLiteralChars);
        if ((0xffffff < iVar2) ||
           (iVar2 = icu_63::UnicodeString::length(&this->fRXPat->fLiteralText), 0xffffff < iVar2)) {
          error(this,U_REGEX_PATTERN_TOO_BIG);
        }
        if ((this->fModeFlags & 2U) == 0) {
          iVar2 = icu_63::UnicodeString::length(&this->fRXPat->fLiteralText);
          appendOp(this,4,iVar2);
        }
        else {
          iVar2 = icu_63::UnicodeString::length(&this->fRXPat->fLiteralText);
          appendOp(this,0x28,iVar2);
        }
        iVar2 = icu_63::UnicodeString::length(&this->fLiteralChars);
        appendOp(this,5,iVar2);
        srcText = &this->fLiteralChars;
        icu_63::UnicodeString::append(&this->fRXPat->fLiteralText,srcText);
      }
      icu_63::UnicodeString::remove(&this->fLiteralChars,(char *)srcText);
    }
    else {
      icu_63::UnicodeString::truncate(&this->fLiteralChars,(char *)(ulong)local_18,__length);
      fixLiterals(this,'\0');
      literalChar(this,local_1c);
      fixLiterals(this,'\0');
    }
  }
  return;
}

Assistant:

void    RegexCompile::fixLiterals(UBool split) {

    // If no literal characters have been scanned but not yet had code generated
    //   for them, nothing needs to be done.
    if (fLiteralChars.length() == 0) {
        return;
    }

    int32_t indexOfLastCodePoint = fLiteralChars.moveIndex32(fLiteralChars.length(), -1);
    UChar32 lastCodePoint = fLiteralChars.char32At(indexOfLastCodePoint);

    // Split:  We need to  ensure that the last item in the compiled pattern
    //     refers only to the last literal scanned in the pattern, so that
    //     quantifiers (*, +, etc.) affect only it, and not a longer string.
    //     Split before case folding for case insensitive matches.

    if (split) {
        fLiteralChars.truncate(indexOfLastCodePoint);
        fixLiterals(FALSE);   // Recursive call, emit code to match the first part of the string.
                              //  Note that the truncated literal string may be empty, in which case
                              //  nothing will be emitted.

        literalChar(lastCodePoint);  // Re-add the last code point as if it were a new literal.
        fixLiterals(FALSE);          // Second recursive call, code for the final code point.
        return;
    }

    // If we are doing case-insensitive matching, case fold the string.  This may expand
    //   the string, e.g. the German sharp-s turns into "ss"
    if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
        fLiteralChars.foldCase();
        indexOfLastCodePoint = fLiteralChars.moveIndex32(fLiteralChars.length(), -1);
        lastCodePoint = fLiteralChars.char32At(indexOfLastCodePoint);
    }

    if (indexOfLastCodePoint == 0) {
        // Single character, emit a URX_ONECHAR op to match it.
        if ((fModeFlags & UREGEX_CASE_INSENSITIVE) &&
                 u_hasBinaryProperty(lastCodePoint, UCHAR_CASE_SENSITIVE)) {
            appendOp(URX_ONECHAR_I, lastCodePoint);
        } else {
            appendOp(URX_ONECHAR, lastCodePoint);
        }
    } else {
        // Two or more chars, emit a URX_STRING to match them.
        if (fLiteralChars.length() > 0x00ffffff || fRXPat->fLiteralText.length() > 0x00ffffff) {
            error(U_REGEX_PATTERN_TOO_BIG);
        }
        if (fModeFlags & UREGEX_CASE_INSENSITIVE) {
            appendOp(URX_STRING_I, fRXPat->fLiteralText.length());
        } else {
            // TODO here:  add optimization to split case sensitive strings of length two
            //             into two single char ops, for efficiency.
            appendOp(URX_STRING, fRXPat->fLiteralText.length());
        }
        appendOp(URX_STRING_LEN, fLiteralChars.length());

        // Add this string into the accumulated strings of the compiled pattern.
        fRXPat->fLiteralText.append(fLiteralChars);
    }

    fLiteralChars.remove();
}